

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_index.cc
# Opt level: O0

bool S2ShapeIndexCell::DecodeEdges(int num_edges,S2ClippedShape *clipped,Decoder *decoder)

{
  uint32 i_00;
  bool bVar1;
  int local_30;
  uint local_2c;
  uint32 count;
  uint32 delta;
  int i;
  int32 edge_id;
  Decoder *decoder_local;
  S2ClippedShape *clipped_local;
  int num_edges_local;
  
  delta = 0;
  count = 0;
  _i = decoder;
  decoder_local = (Decoder *)clipped;
  clipped_local._0_4_ = num_edges;
  while( true ) {
    if ((int)clipped_local <= (int)count) {
      return true;
    }
    bVar1 = Decoder::get_varint32(_i,&local_2c);
    i_00 = count;
    if (!bVar1) break;
    if (count + 1 == (int)clipped_local) {
      count = count + 1;
      S2ClippedShape::set_edge((S2ClippedShape *)decoder_local,i_00,delta + local_2c);
    }
    else {
      local_30 = (local_2c & 7) + 1;
      local_2c = local_2c >> 3;
      if (local_30 == 8) {
        local_30 = local_2c + 8;
        bVar1 = Decoder::get_varint32(_i,&local_2c);
        if (!bVar1) {
          return false;
        }
      }
      delta = local_2c + delta;
      for (; local_30 != 0; local_30 = local_30 + -1) {
        S2ClippedShape::set_edge((S2ClippedShape *)decoder_local,count,delta);
        count = count + 1;
        delta = delta + 1;
      }
    }
  }
  return false;
}

Assistant:

inline bool S2ShapeIndexCell::DecodeEdges(int num_edges,
                                          S2ClippedShape* clipped,
                                          Decoder* decoder) {
  // This function inverts the encodings documented above.
  int32 edge_id = 0;
  for (int i = 0; i < num_edges; ) {
    uint32 delta;
    if (!decoder->get_varint32(&delta)) return false;
    if (i + 1 == num_edges) {
      // The last edge is encoded without an edge count.
      clipped->set_edge(i++, edge_id + delta);
    } else {
      // Otherwise decode the count and edge delta.
      uint32 count = (delta & 7) + 1;
      delta >>= 3;
      if (count == 8) {
        count = delta + 8;
        if (!decoder->get_varint32(&delta)) return false;
      }
      edge_id += delta;
      for (; count > 0; --count, ++i, ++edge_id) {
        clipped->set_edge(i, edge_id);
      }
    }
  }
  return true;
}